

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * pred(ll_head *q_head,ll_elem *n)

{
  elem_ptr_t *ptr;
  long *plVar1;
  int iVar2;
  ll_elem *in_RAX;
  ll_head *q_head_00;
  ll_head *plVar3;
  size_t extraout_RDX;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  size_t extraout_RDX_00;
  size_t count_03;
  size_t count_04;
  size_t count_05;
  ulong uVar4;
  ulong uVar5;
  ll_elem *p_;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x147,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  uVar4 = (ulong)n & 0xfffffffffffffffc;
  if (uVar4 != 0) {
    ptr = (elem_ptr_t *)(uVar4 + 8);
    p_ = in_RAX;
    q_head_00 = (ll_head *)deref(ptr);
    if ((ll_head *)0x3 < q_head_00) {
      while( true ) {
        if (q_head_00 < (ll_head *)0x4) {
          __assert_fail("ptr_clear(p) != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x155,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
        }
        plVar3 = q_head_00;
        if (((ulong)q_head_00 & 2) == 0) {
          plVar3 = (ll_head *)succ(q_head,&q_head_00->q);
          count = extraout_RDX;
          if (plVar3 < (ll_head *)0x4) {
            __assert_fail("ptr_clear(ps) != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0x15f,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
          }
          while ((((ulong)q_head_00 & 2) == 0 &&
                 (uVar5 = (ulong)plVar3 & 0xfffffffffffffffc, uVar5 != uVar4))) {
            p_ = &q_head_00->q;
            iVar2 = ptr_cas(ptr,&p_,&plVar3->q);
            if (iVar2 == 0) {
              deref_release(plVar3,(ll_elem *)0x1,count_00);
              deref_release(q_head_00,(ll_elem *)0x1,count_02);
              q_head_00 = (ll_head *)deref(ptr);
            }
            else {
              LOCK();
              *(long *)(uVar5 + 0x10) = *(long *)(uVar5 + 0x10) + 1;
              UNLOCK();
              ptr_clear_deref(ptr);
              deref_release(q_head_00,(ll_elem *)0x2,count_01);
              q_head_00 = (ll_head *)((uint)p_ & 2 | uVar5);
            }
            plVar3 = (ll_head *)succ(q_head,&q_head_00->q);
            count = extraout_RDX_00;
          }
          deref_release(plVar3,(ll_elem *)0x1,count);
          plVar3 = q_head_00;
        }
        uVar5 = (ulong)plVar3 & 0xfffffffffffffffc;
        if ((*(ulong *)(uVar5 + 8) & 2) == 0) break;
        q_head_00 = (ll_head *)deref((elem_ptr_t *)(uVar5 + 8));
        p_ = &plVar3->q;
        iVar2 = ptr_cas(ptr,&p_,(ll_elem *)q_head_00);
        if (iVar2 == 0) {
          deref_release(plVar3,(ll_elem *)0x1,count_03);
          deref_release(q_head_00,(ll_elem *)0x1,count_05);
          q_head_00 = (ll_head *)deref(ptr);
        }
        else {
          LOCK();
          plVar1 = (long *)(((ulong)q_head_00 & 0xfffffffffffffffc) + 0x10);
          *plVar1 = *plVar1 + 1;
          UNLOCK();
          ptr_clear_deref(ptr);
          deref_release(plVar3,(ll_elem *)0x2,count_04);
        }
      }
      q_head_00 = (ll_head *)((uint)*ptr & 2 | uVar5);
    }
    return &q_head_00->q;
  }
  __assert_fail("n != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x149,
                "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
}

Assistant:

static struct ll_elem*
pred(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *ps, *pp;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	p = deref(&n->pred);
	if (ptr_clear(p) == NULL)
		return p;

	for (;;) {
		/*
		 * Predecessor cannot be null,
		 * since it is on the queue and we have a reference to n,
		 * preventing it from leaving the queue.
		 */
		assert(ptr_clear(p) != NULL);

		/*
		 * Search forward to reach the direct predecessor of
		 * n between p and n.  Note that we cannot search for
		 * a better predecessor when p holds the deletion mark
		 * for n.
		 */
		if (!deleted_ptr(p)) {
			ps = succ(q_head, p);
			assert(ptr_clear(ps) != NULL);
			while (ptr_clear(ps) != n && !deleted_ptr(p)) {
				p_ = p;
				if (ptr_cas(&n->pred, &p_, ps)) {
					/* cas succeeded */
					deref_acquire(ps, 1);
					ptr_clear_deref(&n->pred);
					deref_release(q_head, p, 2);
					p = flag_combine(ps, p_);
				} else {
					/* cas failed */
					deref_release(q_head, ps, 1);
					deref_release(q_head, p, 1);

					/*
					 * Cannot do p = p_, since we do not
					 * have the lock on n->pred at the
					 * moment and thus cannot acquire the
					 * reference counter on p_.
					 */
					p = deref(&n->pred);
				}

				ps = succ(q_head, p);
			}
			deref_release(q_head, ps, 1);
		}

		/*
		 * p is the best predecessor, provided it is not a deleted value.
		 */
		if (!deleted(p))
			break;		/* GUARD */

		/*
		 * Skip to the predecessor of p, since p is deleted.
		 */
		pp = deref(&ptr_clear(p)->pred);
		p_ = p;
		if (ptr_cas(&n->pred, &p_, pp)) {
			/* cas succeeded */
			deref_acquire(pp, 1);
			ptr_clear_deref(&n->pred);
			deref_release(q_head, p, 2);
			p = pp;
		} else {
			/* cas failed */
			deref_release(q_head, p, 1);
			deref_release(q_head, pp, 1);
			p = deref(&n->pred);
		}
	}

	return flag_combine(p, (struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed));
}